

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safety_check.c
# Opt level: O3

void duckdb_je_safety_check_fail_sized_dealloc
               (_Bool current_dealloc,void *ptr,size_t true_size,size_t input_size)

{
  undefined7 in_register_00000039;
  char *pcVar1;
  
  pcVar1 = "in thread cache, possibly from previous deallocations";
  if ((int)CONCAT71(in_register_00000039,current_dealloc) != 0) {
    pcVar1 = "the current pointer being freed";
  }
  duckdb_je_safety_check_fail
            ("<jemalloc>: size mismatch detected (true size %zu vs input size %zu), likely caused by application sized deallocation bugs (source address: %p, %s). Suggest building with%s address sanitizer for debugging. Abort.\n"
             ,true_size,input_size,ptr,pcVar1," --enable-debug or");
  return;
}

Assistant:

void safety_check_fail_sized_dealloc(bool current_dealloc, const void *ptr,
    size_t true_size, size_t input_size) {
	char *src = current_dealloc ? "the current pointer being freed" :
	    "in thread cache, possibly from previous deallocations";
	char *suggest_debug_build = config_debug ? "" : " --enable-debug or";

	safety_check_fail("<jemalloc>: size mismatch detected (true size %zu "
	    "vs input size %zu), likely caused by application sized "
	    "deallocation bugs (source address: %p, %s). Suggest building with"
	    "%s address sanitizer for debugging. Abort.\n",
	    true_size, input_size, ptr, src, suggest_debug_build);
}